

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<char> *a)

{
  size_t count_00;
  char *p;
  bool local_1d;
  ON__INT32 local_1c;
  bool rc;
  ON_SimpleArray<char> *pOStack_18;
  int count;
  ON_SimpleArray<char> *a_local;
  ON_BinaryArchive *this_local;
  
  pOStack_18 = a;
  a_local = (ON_SimpleArray<char> *)this;
  ON_SimpleArray<char>::Empty(a);
  local_1c = 0;
  local_1d = ReadInt(this,&local_1c);
  if ((local_1d) && (0 < local_1c)) {
    ON_SimpleArray<char>::SetCapacity(pOStack_18,(long)local_1c);
    count_00 = (size_t)local_1c;
    p = ON_SimpleArray<char>::Array(pOStack_18);
    local_1d = ReadChar(this,count_00,p);
    if (local_1d) {
      ON_SimpleArray<char>::SetCount(pOStack_18,local_1c);
    }
  }
  return local_1d;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<char>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) {
    a.SetCapacity( count );
    rc = ReadChar( count, a.Array() );
    if ( rc )
      a.SetCount(count);
  }
  return rc;
}